

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsSamplers.h
# Opt level: O1

int __thiscall
chrono::utils::Sampler<double>::accept
          (Sampler<double> *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar15 [16];
  
  if (4 < (uint)__fd) {
    return 0;
  }
  dVar14 = *(double *)__addr - (this->m_center).m_data[0];
  dVar2 = *(double *)(__addr->sa_data + 6) - (this->m_center).m_data[1];
  dVar3 = *(double *)(__addr + 1) - (this->m_center).m_data[2];
  dVar1 = (this->m_size).m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1;
  uVar4 = vcmpsd_avx512f(auVar21,ZEXT816(0x3ff0000000000000),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  dVar11 = (double)((ulong)bVar5 * (long)(dVar1 * 1e-06) + (ulong)!bVar5 * 0x3eb0c6f7a0b5ed8d);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar14;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  switch(__fd) {
  case 0:
    auVar9._8_8_ = 0x7fffffffffffffff;
    auVar9._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar19,auVar9);
    if (dVar1 + dVar11 < auVar12._0_8_) {
      return 0;
    }
    auVar10._8_8_ = 0x7fffffffffffffff;
    auVar10._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar17,auVar10);
    if (dVar11 + (this->m_size).m_data[1] < auVar12._0_8_) {
      return 0;
    }
    goto LAB_00945d08;
  case 1:
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar2 * dVar2;
    auVar17 = vfmadd213sd_fma(auVar19,auVar19,auVar13);
    auVar12 = vfmadd213sd_fma(auVar12,auVar12,auVar17);
    dVar14 = auVar12._0_8_;
    dVar11 = dVar1 * dVar1;
    break;
  case 2:
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar3 * dVar3;
    auVar12 = vfmadd213sd_fma(auVar17,auVar17,auVar16);
    dVar14 = (this->m_size).m_data[1];
    if (dVar14 * dVar14 < auVar12._0_8_) {
      return 0;
    }
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar19,auVar8);
    dVar14 = auVar12._0_8_;
    dVar11 = dVar1 + dVar11;
    break;
  case 3:
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar14 * dVar14;
    auVar12 = vfmadd213sd_fma(auVar12,auVar12,auVar20);
    dVar1 = (this->m_size).m_data[2];
    if (dVar1 * dVar1 < auVar12._0_8_) {
      return 0;
    }
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar17,auVar7);
    dVar14 = auVar12._0_8_;
    dVar11 = dVar11 + (this->m_size).m_data[1];
    break;
  case 4:
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar2 * dVar2;
    auVar12 = vfmadd213sd_fma(auVar19,auVar19,auVar18);
    if (dVar1 * dVar1 < auVar12._0_8_) {
      return 0;
    }
LAB_00945d08:
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar3;
    auVar12 = vandpd_avx512vl(auVar15,auVar6);
    dVar14 = auVar12._0_8_;
    dVar11 = dVar11 + (this->m_size).m_data[2];
  }
  return (int)CONCAT71((int7)((ulong)((long)&switchD_00945cc8::switchdataD_00a19b74 +
                                     (long)(int)(&switchD_00945cc8::switchdataD_00a19b74)
                                                [(uint)__fd]) >> 8),dVar14 <= dVar11);
}

Assistant:

bool accept(VolumeType t, const ChVector<T>& p) const {
        ChVector<T> vec = p - m_center;
        T fuzz = (m_size.x() < 1) ? (T)1e-6 * m_size.x() : (T)1e-6;

        switch (t) {
            case BOX:
                return (std::abs(vec.x()) <= m_size.x() + fuzz) && (std::abs(vec.y()) <= m_size.y() + fuzz) &&
                       (std::abs(vec.z()) <= m_size.z() + fuzz);
            case SPHERE:
                return (vec.Length2() <= m_size.x() * m_size.x());
            case CYLINDER_X:
                return (vec.y() * vec.y() + vec.z() * vec.z() <= m_size.y() * m_size.y()) && (std::abs(vec.x()) <= m_size.x() + fuzz);
            case CYLINDER_Y:
                return (vec.z() * vec.z() + vec.x() * vec.x() <= m_size.z() * m_size.z()) && (std::abs(vec.y()) <= m_size.y() + fuzz);
            case CYLINDER_Z:
                return (vec.x() * vec.x() + vec.y() * vec.y() <= m_size.x() * m_size.x()) && (std::abs(vec.z()) <= m_size.z() + fuzz);
            default:
                return false;
        }
    }